

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFReadFromUserBuffer
              (TIFF *tif,uint32_t strile,void *inbuf,tmsize_t insize,void *outbuf,tmsize_t outsize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  tmsize_t tVar4;
  uint8_t *puVar5;
  int iVar6;
  uint local_64;
  uint32_t stripsperplane;
  uint32_t rowsperstrip;
  void *old_rawdata;
  tmsize_t old_rawdatasize;
  uint32_t old_tif_flags;
  int ret;
  TIFFDirectory *td;
  tmsize_t outsize_local;
  void *outbuf_local;
  tmsize_t insize_local;
  void *inbuf_local;
  uint32_t strile_local;
  TIFF *tif_local;
  
  old_rawdatasize._4_4_ = 1;
  uVar1 = tif->tif_flags;
  tVar4 = tif->tif_rawdatasize;
  puVar5 = tif->tif_rawdata;
  if (tif->tif_mode == 1) {
    TIFFErrorExtR(tif,tif->tif_name,"File not open for reading");
    tif_local._4_4_ = 0;
  }
  else if ((tif->tif_flags & 0x20000) == 0) {
    tif->tif_flags = tif->tif_flags & 0xfffffdff;
    tif->tif_flags = tif->tif_flags | 0x800000;
    tif->tif_rawdatasize = insize;
    tif->tif_rawdata = (uint8_t *)inbuf;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = insize;
    if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
       ((tif->tif_flags & 0x100) == 0)) {
      TIFFReverseBits((uint8_t *)inbuf,insize);
    }
    iVar6 = TIFFIsTiled(tif);
    if (iVar6 == 0) {
      local_64 = (tif->tif_dir).td_rowsperstrip;
      if ((tif->tif_dir).td_imagelength < local_64) {
        local_64 = (tif->tif_dir).td_imagelength;
      }
      uVar2 = (tif->tif_dir).td_imagelength;
      uVar3 = (tif->tif_dir).td_imagelength;
      iVar6 = TIFFStartStrip(tif,strile);
      if ((iVar6 == 0) ||
         (iVar6 = (*tif->tif_decodestrip)
                            (tif,(uint8_t *)outbuf,outsize,
                             (uint16_t)(strile / (uVar2 / local_64 + (uint)(uVar3 % local_64 != 0)))
                            ), iVar6 == 0)) {
        old_rawdatasize._4_4_ = 0;
      }
    }
    else {
      iVar6 = TIFFStartTile(tif,strile);
      if ((iVar6 == 0) ||
         (iVar6 = (*tif->tif_decodetile)
                            (tif,(uint8_t *)outbuf,outsize,
                             (uint16_t)(strile / (tif->tif_dir).td_stripsperimage)), iVar6 == 0)) {
        old_rawdatasize._4_4_ = 0;
      }
    }
    if (old_rawdatasize._4_4_ != 0) {
      (*tif->tif_postdecode)(tif,(uint8_t *)outbuf,outsize);
    }
    if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
       ((tif->tif_flags & 0x100) == 0)) {
      TIFFReverseBits((uint8_t *)inbuf,insize);
    }
    tif->tif_flags = uVar1 & 0x800200 | tif->tif_flags & 0xff7ffdff;
    tif->tif_rawdatasize = tVar4;
    tif->tif_rawdata = puVar5;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = 0;
    tif_local._4_4_ = old_rawdatasize._4_4_;
  }
  else {
    TIFFErrorExtR(tif,"TIFFReadFromUserBuffer",
                  "Compression scheme does not support access to raw uncompressed data");
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFReadFromUserBuffer(TIFF *tif, uint32_t strile, void *inbuf,
                           tmsize_t insize, void *outbuf, tmsize_t outsize)
{
    static const char module[] = "TIFFReadFromUserBuffer";
    TIFFDirectory *td = &tif->tif_dir;
    int ret = 1;
    uint32_t old_tif_flags = tif->tif_flags;
    tmsize_t old_rawdatasize = tif->tif_rawdatasize;
    void *old_rawdata = tif->tif_rawdata;

    if (tif->tif_mode == O_WRONLY)
    {
        TIFFErrorExtR(tif, tif->tif_name, "File not open for reading");
        return 0;
    }
    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        TIFFErrorExtR(tif, module,
                      "Compression scheme does not support access to raw "
                      "uncompressed data");
        return 0;
    }

    tif->tif_flags &= ~TIFF_MYBUFFER;
    tif->tif_flags |= TIFF_BUFFERMMAP;
    tif->tif_rawdatasize = insize;
    tif->tif_rawdata = inbuf;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = insize;

    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
    {
        TIFFReverseBits(inbuf, insize);
    }

    if (TIFFIsTiled(tif))
    {
        if (!TIFFStartTile(tif, strile) ||
            !(*tif->tif_decodetile)(tif, (uint8_t *)outbuf, outsize,
                                    (uint16_t)(strile / td->td_stripsperimage)))
        {
            ret = 0;
        }
    }
    else
    {
        uint32_t rowsperstrip = td->td_rowsperstrip;
        uint32_t stripsperplane;
        if (rowsperstrip > td->td_imagelength)
            rowsperstrip = td->td_imagelength;
        stripsperplane =
            TIFFhowmany_32_maxuint_compat(td->td_imagelength, rowsperstrip);
        if (!TIFFStartStrip(tif, strile) ||
            !(*tif->tif_decodestrip)(tif, (uint8_t *)outbuf, outsize,
                                     (uint16_t)(strile / stripsperplane)))
        {
            ret = 0;
        }
    }
    if (ret)
    {
        (*tif->tif_postdecode)(tif, (uint8_t *)outbuf, outsize);
    }

    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
    {
        TIFFReverseBits(inbuf, insize);
    }

    tif->tif_flags = (old_tif_flags & (TIFF_MYBUFFER | TIFF_BUFFERMMAP)) |
                     (tif->tif_flags & ~(TIFF_MYBUFFER | TIFF_BUFFERMMAP));
    tif->tif_rawdatasize = old_rawdatasize;
    tif->tif_rawdata = old_rawdata;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = 0;

    return ret;
}